

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,
          FileDescriptorProto *containing_file,OptionStyle style)

{
  ErrorCollector *pEVar1;
  undefined8 source_code_info;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int path2;
  undefined4 extraout_var;
  FieldDescriptor *field;
  LogMessage *pLVar5;
  UninterpretedOption *uninterpreted_option;
  string *value;
  pointer pcVar6;
  FileDescriptorProto *containing_file_00;
  long lVar7;
  uint uVar8;
  Reflection *this_00;
  Reflection *this_01;
  LocationRecorder *this_02;
  LocationRecorder name_location;
  LocationRecorder part_location;
  LocationRecorder location;
  undefined1 local_b0 [63];
  LogFinisher local_71;
  LocationRecorder local_70;
  OptionStyle local_54;
  LocationRecorder local_50;
  SourceCodeInfo *local_38;
  
  local_54 = style;
  iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"uninterpreted_option","");
  field = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar4),(string *)local_b0)
  ;
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (field == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x58e);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)local_b0,"CHECK failed: uninterpreted_option_field != NULL: ")
    ;
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  iVar4 = *(int *)(field + 0x44);
  path2 = Reflection::FieldSize(this_00,options,field);
  LocationRecorder::LocationRecorder(&local_50,options_location,iVar4,path2);
  if ((local_54 != OPTION_STATEMENT) || (bVar2 = Consume(this,"option"), bVar2)) {
    (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
    containing_file_00 = (FileDescriptorProto *)0x0;
    uninterpreted_option =
         (UninterpretedOption *)Reflection::AddMessage(this_01,options,field,(MessageFactory *)0x0);
    local_38 = local_50.source_code_info_;
    LocationRecorder::Init((LocationRecorder *)local_b0,&local_50,local_50.source_code_info_);
    LocationRecorder::AddPath((LocationRecorder *)local_b0,2);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_b0,(Message *)uninterpreted_option,OPTION_NAME);
    source_code_info = local_b0._8_8_;
    iVar4 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    LocationRecorder::Init(&local_70,(LocationRecorder *)local_b0,(SourceCodeInfo *)local_b0._8_8_);
    LocationRecorder::AddPath(&local_70,iVar4);
    bVar2 = ParseOptionNamePart(this,uninterpreted_option,&local_70,containing_file_00);
    LocationRecorder::~LocationRecorder(&local_70);
    if (bVar2) {
LAB_0031181d:
      iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar4 != 0) {
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_b0);
        bVar2 = Consume(this,"=");
        if (!bVar2) goto LAB_00311887;
        LocationRecorder::Init(&local_70,&local_50,local_38);
        LocationRecorder::RecordLegacyLocation
                  (&local_70,(Message *)uninterpreted_option,OPTION_VALUE);
        bVar2 = TryConsume(this,"-");
        switch((this->input_->current_).type) {
        case TYPE_START:
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_b0,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
                     ,0x5c3);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)local_b0,
                              "Trying to read value before any tokens have been read.");
          internal::LogFinisher::operator=(&local_71,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_b0);
          break;
        case TYPE_END:
          local_b0._0_8_ = local_b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b0,"Unexpected end of stream while parsing option value.","");
          pEVar1 = this->error_collector_;
          if (pEVar1 != (ErrorCollector *)0x0) {
            (*pEVar1->_vptr_ErrorCollector[2])
                      (pEVar1,(ulong)(uint)(this->input_->current_).line,
                       (ulong)(uint)(this->input_->current_).column,local_b0);
          }
          goto LAB_00311b59;
        case TYPE_IDENTIFIER:
          LocationRecorder::AddPath(&local_70,3);
          if (!bVar2) {
            local_b0._0_8_ = local_b0 + 0x10;
            local_b0._8_8_ = (SourceCodeInfo *)0x0;
            local_b0[0x10] = '\0';
            bVar2 = ConsumeIdentifier(this,(string *)local_b0,"Expected identifier.");
            if (!bVar2) goto LAB_00311b5d;
            UninterpretedOption::set_identifier_value(uninterpreted_option,(string *)local_b0);
LAB_00311bf3:
            if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
              operator_delete((void *)local_b0._0_8_);
            }
            goto switchD_0031191c_default;
          }
          local_b0._0_8_ = local_b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b0,"Invalid \'-\' symbol before identifier.","");
          pEVar1 = this->error_collector_;
          if (pEVar1 != (ErrorCollector *)0x0) {
            (*pEVar1->_vptr_ErrorCollector[2])
                      (pEVar1,(ulong)(uint)(this->input_->current_).line,
                       (ulong)(uint)(this->input_->current_).column,local_b0);
          }
LAB_00311b59:
          this->had_errors_ = true;
LAB_00311b5d:
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_);
          }
          break;
        case TYPE_INTEGER:
          bVar3 = ConsumeInteger64(this,(ulong)bVar2 - 1 | 0x8000000000000000,(uint64 *)local_b0,
                                   "Expected integer.");
          if (bVar3) {
            if (bVar2) {
              LocationRecorder::AddPath(&local_70,5);
              lVar7 = 0x50;
              uVar8 = 0x10;
              pcVar6 = (pointer)-local_b0._0_8_;
            }
            else {
              LocationRecorder::AddPath(&local_70,4);
              lVar7 = 0x48;
              uVar8 = 8;
              pcVar6 = (pointer)local_b0._0_8_;
            }
            (uninterpreted_option->_has_bits_).has_bits_[0] =
                 (uninterpreted_option->_has_bits_).has_bits_[0] | uVar8;
            *(pointer *)
             ((long)&(((UninterpretedOption *)(&uninterpreted_option->_has_bits_ + -4))->
                     super_Message).super_MessageLite._vptr_MessageLite + lVar7) = pcVar6;
            goto switchD_0031191c_default;
          }
          break;
        case TYPE_FLOAT:
          LocationRecorder::AddPath(&local_70,6);
          bVar3 = ConsumeNumber(this,(double *)local_b0,"Expected number.");
          if (bVar3) {
            pcVar6 = (pointer)local_b0._0_8_;
            if (bVar2) {
              pcVar6 = (pointer)(local_b0._0_8_ ^ 0x8000000000000000);
            }
            (uninterpreted_option->_has_bits_).has_bits_[0] =
                 (uninterpreted_option->_has_bits_).has_bits_[0] | 0x20;
            uninterpreted_option->double_value_ = (double)pcVar6;
            goto switchD_0031191c_default;
          }
          break;
        case TYPE_STRING:
          LocationRecorder::AddPath(&local_70,7);
          if (bVar2) {
            local_b0._0_8_ = local_b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,"Invalid \'-\' symbol before string.","");
            pEVar1 = this->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,local_b0);
            }
            goto LAB_00311b59;
          }
          local_b0._0_8_ = local_b0 + 0x10;
          local_b0._8_8_ = (SourceCodeInfo *)0x0;
          local_b0[0x10] = '\0';
          bVar2 = ConsumeString(this,(string *)local_b0,"Expected string.");
          if (bVar2) {
            UninterpretedOption::set_string_value(uninterpreted_option,(string *)local_b0);
            goto LAB_00311bf3;
          }
          goto LAB_00311b5d;
        case TYPE_SYMBOL:
          iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar4 != 0) {
            local_b0._0_8_ = local_b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,"Expected option value.","");
            pEVar1 = this->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,local_b0);
            }
            goto LAB_00311b59;
          }
          LocationRecorder::AddPath(&local_70,8);
          value = UninterpretedOption::mutable_aggregate_value_abi_cxx11_(uninterpreted_option);
          bVar2 = ParseUninterpretedBlock(this,value);
          if (bVar2) goto switchD_0031191c_default;
          break;
        default:
switchD_0031191c_default:
          LocationRecorder::~LocationRecorder(&local_70);
          if ((local_54 == OPTION_STATEMENT) &&
             (bVar2 = ConsumeEndOfDeclaration(this,";",&local_50), !bVar2)) goto LAB_00311887;
          bVar2 = true;
          goto LAB_00311889;
        }
        this_02 = &local_70;
        goto LAB_00311882;
      }
      bVar2 = Consume(this,".");
      if (bVar2) goto code_r0x00311843;
    }
LAB_0031187d:
    this_02 = (LocationRecorder *)local_b0;
LAB_00311882:
    LocationRecorder::~LocationRecorder(this_02);
  }
LAB_00311887:
  bVar2 = false;
LAB_00311889:
  LocationRecorder::~LocationRecorder(&local_50);
  return bVar2;
code_r0x00311843:
  iVar4 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
  LocationRecorder::Init(&local_70,(LocationRecorder *)local_b0,(SourceCodeInfo *)source_code_info);
  LocationRecorder::AddPath(&local_70,iVar4);
  bVar2 = ParseOptionNamePart(this,uninterpreted_option,&local_70,containing_file_00);
  LocationRecorder::~LocationRecorder(&local_70);
  if (!bVar2) goto LAB_0031187d;
  goto LAB_0031181d;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         const FileDescriptorProto* containing_file,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option =
      down_cast<UninterpretedOption*>(options->GetReflection()->AddMessage(
          options, uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        std::string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              static_cast<int64>(-value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        std::string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}